

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.h
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,BoundTreeNode *n)

{
  char *pcVar1;
  ostream *poVar2;
  Exception *this;
  string local_40;
  
  if (n->_type == VAR) {
    pcVar1 = "\tv";
  }
  else {
    if (n->_type != FACTOR) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"./bounds.h, line 55","");
      Exception::Exception(this,4,&local_40);
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = "\tf";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1 + 1,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  return poVar2;
}

Assistant:

std::ostream& operator << (std::ostream& os, const BoundTreeNode& n) { 
                if( n._type == BoundTreeNode::VAR )
                    return( os << "v" << n._id ); 
                else if( n._type == BoundTreeNode::FACTOR ) 
                    return( os << "f" << n._id ); 
                else
                    DAI_THROW(UNKNOWN_ENUM_VALUE);
            }